

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

void __thiscall
gmath::DMatrix<double>::DMatrix<double,3,3>(DMatrix<double> *this,SMatrix<double,_3,_3> *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  SMatrix<double,_3,_3> *in_RSI;
  undefined4 *in_RDI;
  double dVar4;
  int i;
  int k;
  int local_18;
  int local_14;
  
  *in_RDI = 3;
  in_RDI[1] = 3;
  in_RDI[2] = 9;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[2];
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 4) = pvVar3;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar4 = SMatrix<double,_3,_3>::operator()(in_RSI,local_14,local_18);
      *(double *)(*(long *)(in_RDI + 4) + (long)(local_14 * 3 + local_18) * 8) = dVar4;
    }
  }
  return;
}

Assistant:

DMatrix(const SMatrix<S, r, c> &a)
    {
      nrows=r;
      ncols=c;
      n=r*c;
      v=new T[n];

      for (int k=0; k<r; k++)
        for (int i=0; i<c; i++)
        {
          v[k*c+i]=a(k, i);
        }
    }